

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall ki::dml::Field<double>::Field(Field<double> *this,string *name)

{
  size_t sVar1;
  string local_38 [32];
  string *local_18;
  string *name_local;
  Field<double> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)name);
  FieldBase::FieldBase(&this->super_FieldBase,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this->super_FieldBase).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_write_to_001dc4d8;
  sVar1 = std::type_info::hash_code((type_info *)&double::typeinfo);
  (this->super_FieldBase).m_type_hash = sVar1;
  this->m_value = 0.0;
  return;
}

Assistant:

Field(std::string name) : FieldBase(name)
		{
			m_type_hash = typeid(ValueT).hash_code();
			m_value = ValueT();
		}